

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

bool utils::inputWaiting(void)

{
  int iVar1;
  int iVar2;
  fd_set *__arr;
  undefined1 auStack_98 [4];
  uint __i;
  timeval tv;
  fd_set fds;
  
  _auStack_98 = 0;
  tv.tv_sec = 1;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    fds.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
  }
  iVar1 = fileno(_stdin);
  iVar2 = fileno(_stdin);
  fds.fds_bits[(long)(iVar2 / 0x40) + -1] =
       1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | fds.fds_bits[(long)(iVar2 / 0x40) + -1];
  iVar1 = select(0x400,(fd_set *)&tv.tv_usec,(fd_set *)0x0,(fd_set *)0x0,(timeval *)auStack_98);
  return iVar1 != 0;
}

Assistant:

bool utils::inputWaiting()
{
#ifdef WIN32
    static int init = 0, pipe;
    static HANDLE inh;
    DWORD dw;
    if (!init) {
        init = 1;
        inh = GetStdHandle(STD_INPUT_HANDLE);
        pipe = !GetConsoleMode(inh, &dw);
        if (!pipe) {
            SetConsoleMode(inh, dw & ~(ENABLE_MOUSE_INPUT | ENABLE_WINDOW_INPUT));
            FlushConsoleInputBuffer(inh);
        }
    }
    if (pipe) {
        if (!PeekNamedPipe(inh, NULL, 0, NULL, &dw, NULL)) {
            return 1;
        }
        return dw > 0;
    }
    else {
        GetNumberOfConsoleInputEvents(inh, &dw);
        return dw <= 1 ? false : dw > 0;
    }
#elif __APPLE__
    fd_set fds;
    struct timeval tv;
    FD_ZERO(&fds);
    FD_SET(fileno(stdin), &fds);
    return select(sizeof(fds) * 8, &fds, nullptr, nullptr, &tv);
#else
    fd_set fds;
    struct timeval tv
    {
        0, 1
    };
    FD_ZERO(&fds);
    FD_SET(fileno(stdin), &fds);
    return select(sizeof(fds) * 8, &fds, nullptr, nullptr, &tv);
#endif
}